

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_214010::CAPIBuildSystemFrontendDelegate::commandFoundDiscoveredDependency
          (CAPIBuildSystemFrontendDelegate *this,Command *command,StringRef path,
          DiscoveredDependencyKind kind)

{
  _func_void_void_ptr_llb_buildsystem_command_t_ptr_char_ptr_llb_buildsystem_discovered_dependency_kind_t
  *p_Var1;
  void *pvVar2;
  StringRef local_58;
  string local_48;
  
  local_58.Length = path.Length;
  local_58.Data = path.Data;
  p_Var1 = (this->cAPIDelegate).command_found_discovered_dependency;
  if (p_Var1 != (_func_void_void_ptr_llb_buildsystem_command_t_ptr_char_ptr_llb_buildsystem_discovered_dependency_kind_t
                 *)0x0) {
    pvVar2 = (this->cAPIDelegate).context;
    llvm::StringRef::str_abi_cxx11_(&local_48,&local_58);
    (*p_Var1)(pvVar2,(llb_buildsystem_command_t *)command,local_48._M_dataplus._M_p,kind);
    std::__cxx11::string::_M_dispose();
  }
  return;
}

Assistant:

virtual void commandFoundDiscoveredDependency(Command* command, StringRef path, DiscoveredDependencyKind kind) override {
    if (cAPIDelegate.command_found_discovered_dependency) {
      cAPIDelegate.command_found_discovered_dependency(
          cAPIDelegate.context,
          (llb_buildsystem_command_t*) command,
          path.str().c_str(),
          (llb_buildsystem_discovered_dependency_kind_t) kind);
    }
  }